

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaction.cpp
# Opt level: O0

void __thiscall QAction::setToolTip(QAction *this,QString *tooltip)

{
  bool bVar1;
  QActionPrivate *rhs;
  QString *in_RSI;
  QActionPrivate *in_RDI;
  QActionPrivate *d;
  
  rhs = d_func((QAction *)0x9763ac);
  bVar1 = ::operator==(in_RSI,(QString *)rhs);
  if (!bVar1) {
    QString::operator=(&rhs->tooltip,(QString *)in_RSI);
    QActionPrivate::sendDataChanged(in_RDI);
  }
  return;
}

Assistant:

void QAction::setToolTip(const QString &tooltip)
{
    Q_D(QAction);
    if (d->tooltip == tooltip)
        return;

    d->tooltip = tooltip;
    d->sendDataChanged();
}